

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossibleAnsiPort(TokenKind kind)

{
  bool bVar1;
  TokenKind in_DI;
  bool local_1;
  
  if (((((in_DI == Identifier) || (in_DI == OpenParenthesis)) || ((ushort)(in_DI - Comma) < 2)) ||
      (((ushort)(in_DI - InOutKeyword) < 2 || (in_DI == InterfaceKeyword)))) ||
     ((in_DI == OutputKeyword || ((in_DI == RefKeyword || (in_DI == VarKeyword)))))) {
    local_1 = true;
  }
  else {
    bVar1 = isNetType(in_DI);
    local_1 = true;
    if (!bVar1) {
      local_1 = isPossibleDataType(in_DI);
    }
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isPossibleAnsiPort(TokenKind kind) {
    switch (kind) {
        case TokenKind::InterfaceKeyword:
        case TokenKind::Identifier:
        case TokenKind::Dot:
        case TokenKind::Comma:
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
        case TokenKind::RefKeyword:
        case TokenKind::VarKeyword:
        case TokenKind::OpenParenthesis:
            return true;
        default:
            return isNetType(kind) || isPossibleDataType(kind);
    }
}